

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

double __thiscall ON_LengthValue::Length(ON_LengthValue *this,ON_UnitSystem *context_unit_system)

{
  LengthUnitSystem LVar1;
  double dVar2;
  double dVar3;
  ON_UnitSystem *context_unit_system_local;
  ON_LengthValue *this_local;
  
  LVar1 = ON_UnitSystem::UnitSystem(context_unit_system);
  if (LVar1 == None) {
    this_local = (ON_LengthValue *)this->m_length;
  }
  else {
    dVar2 = ON_UnitSystem::MetersPerUnit(&this->m_length_unit_system,ON_DBL_QNAN);
    dVar3 = ON_UnitSystem::MetersPerUnit(context_unit_system,ON_DBL_QNAN);
    if (((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) &&
       (LVar1 = ON_UnitSystem::UnitSystem(context_unit_system), LVar1 != Unset)) {
      return this->m_length;
    }
    dVar2 = this->m_length;
    dVar3 = ON::UnitScale(&this->m_length_unit_system,context_unit_system);
    this_local = (ON_LengthValue *)(dVar2 * dVar3);
  }
  return (double)this_local;
}

Assistant:

double ON_LengthValue::Length(
  const ON_UnitSystem& context_unit_system
) const
{
  if ( ON::LengthUnitSystem::None == context_unit_system.UnitSystem())
    return m_length;
  if ( 
    m_length_unit_system.MetersPerUnit(ON_DBL_QNAN) == context_unit_system.MetersPerUnit(ON_DBL_QNAN)
    && ON::LengthUnitSystem::Unset != context_unit_system.UnitSystem() 
    )
    return m_length;
  return m_length*ON::UnitScale(m_length_unit_system, context_unit_system);
}